

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cni.hpp
# Opt level: O0

_Deque_iterator<cs_impl::any,_cs_impl::any_&,_cs_impl::any_*> * __thiscall
cs_impl::
cni_helper<std::_Deque_iterator<cs_impl::any,cs_impl::any&,cs_impl::any*>(*)(std::_Deque_iterator<cs_impl::any,cs_impl::any&,cs_impl::any*>&,cs::numeric_const&),std::_Deque_iterator<cs_impl::any,cs_impl::any&,cs_impl::any*>(*)(std::_Deque_iterator<cs_impl::any,cs_impl::any&,cs_impl::any*>&,cs::numeric_const&)>
::_call<0,1>(cni_helper<std::_Deque_iterator<cs_impl::any,_cs_impl::any_&,_cs_impl::any_*>_(*)(std::_Deque_iterator<cs_impl::any,_cs_impl::any_&,_cs_impl::any_*>_&,_const_cs::numeric_&),_std::_Deque_iterator<cs_impl::any,_cs_impl::any_&,_cs_impl::any_*>_(*)(std::_Deque_iterator<cs_impl::any,_cs_impl::any_&,_cs_impl::any_*>_&,_const_cs::numeric_&)>
             *this,vector *args,sequence<0,_1> *param_3)

{
  _Deque_iterator<cs_impl::any,_cs_impl::any_&,_cs_impl::any_*> *p_Var1;
  vector<cs_impl::any,_std::allocator<cs_impl::any>_> *in_RDX;
  _Deque_iterator<cs_impl::any,_cs_impl::any_&,_cs_impl::any_*> *in_RDI;
  var *in_stack_000000c0;
  _Deque_iterator<cs_impl::any,_cs_impl::any_&,_cs_impl::any_*> *this_00;
  _Deque_iterator<cs_impl::any,_cs_impl::any_&,_cs_impl::any_*> local_40;
  vector<cs_impl::any,_std::allocator<cs_impl::any>_> *local_18;
  
  this_00 = in_RDI;
  local_18 = in_RDX;
  std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>::operator[](in_RDX,0);
  p_Var1 = try_convert_and_check<std::_Deque_iterator<cs_impl::any,_cs_impl::any_&,_cs_impl::any_*>_&,_std::_Deque_iterator<cs_impl::any,_cs_impl::any_&,_cs_impl::any_*>_&,_std::_Deque_iterator<cs_impl::any,_cs_impl::any_&,_cs_impl::any_*>,_0UL>
           ::convert(in_stack_000000c0);
  std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>::operator[](local_18,1);
  try_convert_and_check<const_cs::numeric_&,_const_cs::numeric_&,_cs::numeric,_1UL>::convert
            (in_stack_000000c0);
  std::
  function<std::_Deque_iterator<cs_impl::any,_cs_impl::any_&,_cs_impl::any_*>_(std::_Deque_iterator<cs_impl::any,_cs_impl::any_&,_cs_impl::any_*>_&,_const_cs::numeric_&)>
  ::operator()((function<std::_Deque_iterator<cs_impl::any,_cs_impl::any_&,_cs_impl::any_*>_(std::_Deque_iterator<cs_impl::any,_cs_impl::any_&,_cs_impl::any_*>_&,_const_cs::numeric_&)>
                *)this_00,in_RDI,(numeric *)p_Var1);
  p_Var1 = type_convertor<std::_Deque_iterator<cs_impl::any,cs_impl::any&,cs_impl::any*>,std::_Deque_iterator<cs_impl::any,cs_impl::any&,cs_impl::any*>>
           ::convert<std::_Deque_iterator<cs_impl::any,cs_impl::any&,cs_impl::any*>>(&local_40);
  std::_Deque_iterator<cs_impl::any,_cs_impl::any_&,_cs_impl::any_*>::_Deque_iterator(in_RDI,p_Var1)
  ;
  return this_00;
}

Assistant:

_Source_RetT _call(cs::vector &args, const cov::sequence<S...> &) const
		{
			return type_convertor<_Target_RetT, _Source_RetT>::convert(
			           mFunc(try_convert<_Target_ArgsT, _Source_ArgsT, S>::convert(args[S])...));
		}